

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O2

void ssh_ntru_client_getpublic(ecdh_key *dh,BinarySink *bs)

{
  ntru_encode_pubkey((uint16_t *)(dh[-2].vt)->getpublic,0x2f9,0x11ef,bs);
  (**(code **)((dh[-1].vt)->new + 0x10))(dh[-1].vt,bs);
  return;
}

Assistant:

static void ssh_ntru_client_getpublic(ecdh_key *dh, BinarySink *bs)
{
    ntru_client_key *nk = container_of(dh, ntru_client_key, ek);

    /*
     * The client's public information is a single SSH string
     * containing the NTRU public key and the Curve25519 public point
     * concatenated. So write both of those into the output
     * BinarySink.
     */
    ntru_encode_pubkey(nk->keypair->h, p_LIVE, q_LIVE, bs);
    ecdh_key_getpublic(nk->curve25519, bs);
}